

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

NumericData * __thiscall
QLocaleData::numericData(NumericData *__return_storage_ptr__,QLocaleData *this,NumberMode mode)

{
  quint8 qVar1;
  ushort uVar2;
  char16_t *pcVar3;
  char32_t cVar4;
  QSystemLocale *pQVar5;
  qint8 qVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QString local_80;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->zeroUcs = &DAT_aaaaaaaaaaaaaaaa;
  memset(__return_storage_ptr__,0,0xb7);
  if (this == locale_data) {
    __return_storage_ptr__->isC = true;
    goto LAB_0031711a;
  }
  uVar7 = (ulong)this->m_zero_idx;
  qVar1 = this->m_zero_size;
  if (qVar1 == '\x02') {
    cVar4 = (uint)(ushort)L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
                          [uVar7 + 1] +
            (uint)(ushort)L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
                          [uVar7] * 0x400 + L'\xfca02400';
LAB_00317065:
    __return_storage_ptr__->zeroUcs = cVar4;
    __return_storage_ptr__->zeroLen = qVar1;
  }
  else if (qVar1 == '\x01') {
    cVar4 = (char32_t)
            (ushort)L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
                    [uVar7];
    goto LAB_00317065;
  }
  uVar2 = this->m_groupDelim_idx;
  (__return_storage_ptr__->group).m_size = (ulong)this->m_groupDelim_size;
  (__return_storage_ptr__->group).m_data =
       L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
       + uVar2;
  uVar2 = this->m_minus_idx;
  (__return_storage_ptr__->minus).m_size = (ulong)this->m_minus_size;
  (__return_storage_ptr__->minus).m_data =
       L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
       + uVar2;
  uVar2 = this->m_plus_idx;
  (__return_storage_ptr__->plus).m_size = (ulong)this->m_plus_size;
  (__return_storage_ptr__->plus).m_data =
       L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
       + uVar2;
  if (mode != IntegerMode) {
    uVar2 = this->m_decimalSeparator_idx;
    (__return_storage_ptr__->decimal).m_size = (ulong)this->m_decimalSeparator_size;
    (__return_storage_ptr__->decimal).m_data =
         L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
         + uVar2;
    if (mode == DoubleScientificMode) {
      uVar2 = this->m_exponential_idx;
      (__return_storage_ptr__->exponent).m_size = (ulong)this->m_exponential_size;
      (__return_storage_ptr__->exponent).m_data =
           L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
           + uVar2;
      __return_storage_ptr__->exponentCyrillic = this->m_script_id == 0x1b;
    }
  }
  if (this != &systemLocaleData) goto LAB_0031711a;
  pQVar5 = systemLocale();
  if (mode != IntegerMode) {
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    local_50 = 2;
    (*pQVar5->_vptr_QSystemLocale[2])(&local_40,pQVar5,2);
    ::QVariant::toString(&local_80,&local_40);
    ::QVariant::~QVariant(&local_40);
    ::QVariant::~QVariant((QVariant *)&local_68);
    pcVar3 = local_80.d.ptr;
    (__return_storage_ptr__->sysDecimal).d.d = local_80.d.d;
    local_80.d.d = (Data *)0x0;
    (__return_storage_ptr__->sysDecimal).d.ptr = local_80.d.ptr;
    local_80.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->sysDecimal).d.size = local_80.d.size;
    if (local_80.d.size != 0) {
      (__return_storage_ptr__->decimal).m_size = local_80.d.size;
      (__return_storage_ptr__->decimal).m_data = pcVar3;
    }
  }
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  local_50 = 2;
  (*pQVar5->_vptr_QSystemLocale[2])(&local_40,pQVar5,4);
  ::QVariant::toString(&local_80,&local_40);
  ::QVariant::~QVariant(&local_40);
  ::QVariant::~QVariant((QVariant *)&local_68);
  pcVar3 = local_80.d.ptr;
  (__return_storage_ptr__->sysGroup).d.d = local_80.d.d;
  local_80.d.d = (Data *)0x0;
  (__return_storage_ptr__->sysGroup).d.ptr = local_80.d.ptr;
  local_80.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->sysGroup).d.size = local_80.d.size;
  if (local_80.d.size != 0) {
    (__return_storage_ptr__->group).m_size = local_80.d.size;
    (__return_storage_ptr__->group).m_data = pcVar3;
  }
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  local_50 = 2;
  (*pQVar5->_vptr_QSystemLocale[2])(&local_40,pQVar5,6);
  ::QVariant::toString(&local_80,&local_40);
  ::QVariant::~QVariant(&local_40);
  ::QVariant::~QVariant((QVariant *)&local_68);
  pcVar3 = local_80.d.ptr;
  (__return_storage_ptr__->sysMinus).d.d = local_80.d.d;
  local_80.d.d = (Data *)0x0;
  (__return_storage_ptr__->sysMinus).d.ptr = local_80.d.ptr;
  local_80.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->sysMinus).d.size = local_80.d.size;
  if (local_80.d.size != 0) {
    (__return_storage_ptr__->minus).m_size = local_80.d.size;
    (__return_storage_ptr__->minus).m_data = pcVar3;
  }
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  local_50 = 2;
  (*pQVar5->_vptr_QSystemLocale[2])(&local_40,pQVar5,0x1a);
  ::QVariant::toString(&local_80,&local_40);
  ::QVariant::~QVariant(&local_40);
  ::QVariant::~QVariant((QVariant *)&local_68);
  pcVar3 = local_80.d.ptr;
  (__return_storage_ptr__->sysPlus).d.d = local_80.d.d;
  local_80.d.d = (Data *)0x0;
  (__return_storage_ptr__->sysPlus).d.ptr = local_80.d.ptr;
  local_80.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->sysPlus).d.size = local_80.d.size;
  if (local_80.d.size != 0) {
    (__return_storage_ptr__->plus).m_size = local_80.d.size;
    (__return_storage_ptr__->plus).m_data = pcVar3;
  }
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  local_50 = 2;
  (*pQVar5->_vptr_QSystemLocale[2])(&local_40,pQVar5,5);
  ::QVariant::toString(&local_80,&local_40);
  ::QVariant::~QVariant(&local_40);
  ::QVariant::~QVariant((QVariant *)&local_68);
  if (local_80.d.size == 2) {
    cVar4 = (uint)(ushort)local_80.d.ptr[1] + (uint)(ushort)*local_80.d.ptr * 0x400 + L'\xfca02400';
    qVar6 = '\x02';
LAB_003173ea:
    __return_storage_ptr__->zeroUcs = cVar4;
    __return_storage_ptr__->zeroLen = qVar6;
  }
  else if (local_80.d.size == 1) {
    cVar4 = (char32_t)(ushort)*local_80.d.ptr;
    qVar6 = '\x01';
    goto LAB_003173ea;
  }
  if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0031711a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QLocaleData::NumericData QLocaleData::numericData(QLocaleData::NumberMode mode) const
{
    NumericData result;
    if (this == c()) {
        result.isC = true;
        return result;
    }
    result.setZero(zero().viewData(single_character_data));
    result.group = groupDelim().viewData(single_character_data);
    // Note: minus, plus and exponent might not actually be single characters.
    result.minus = minus().viewData(single_character_data);
    result.plus = plus().viewData(single_character_data);
    if (mode != IntegerMode)
        result.decimal = decimalSeparator().viewData(single_character_data);
    if (mode == DoubleScientificMode) {
        result.exponent = exponential().viewData(single_character_data);
        // exponentCyrillic means "apply the Cyrrilic-specific exponent hack"
        result.exponentCyrillic = m_script_id == QLocale::CyrillicScript;
    }
#ifndef QT_NO_SYSTEMLOCALE
    if (this == &systemLocaleData) {
        const auto getString = [sys = systemLocale()](QSystemLocale::QueryType query) {
            return sys->query(query).toString();
        };
        if (mode != IntegerMode) {
            result.sysDecimal = getString(QSystemLocale::DecimalPoint);
            if (result.sysDecimal.size())
                result.decimal = QStringView{result.sysDecimal};
        }
        result.sysGroup = getString(QSystemLocale::GroupSeparator);
        if (result.sysGroup.size())
            result.group = QStringView{result.sysGroup};
        result.sysMinus = getString(QSystemLocale::NegativeSign);
        if (result.sysMinus.size())
            result.minus = QStringView{result.sysMinus};
        result.sysPlus = getString(QSystemLocale::PositiveSign);
        if (result.sysPlus.size())
            result.plus = QStringView{result.sysPlus};
        result.setZero(getString(QSystemLocale::ZeroDigit));
    }
#endif

    return result;
}